

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall
QAbstractGraphicsShapeItem::QAbstractGraphicsShapeItem
          (QAbstractGraphicsShapeItem *this,QGraphicsItem *parent)

{
  QGraphicsItemPrivate *pQVar1;
  long lVar2;
  qreal *pqVar3;
  QTransform *pQVar4;
  byte bVar5;
  
  bVar5 = 0;
  pQVar1 = (QGraphicsItemPrivate *)operator_new(0x1a8);
  (pQVar1->extras).d.d = (Data *)0x0;
  (pQVar1->extras).d.ptr = (ExtraStruct *)0x0;
  (pQVar1->extras).d.size = 0;
  (pQVar1->childrenBoundingRect).xp = 0.0;
  (pQVar1->childrenBoundingRect).yp = 0.0;
  (pQVar1->childrenBoundingRect).w = 0.0;
  (pQVar1->childrenBoundingRect).h = 0.0;
  (pQVar1->needsRepaint).xp = 0.0;
  (pQVar1->needsRepaint).yp = 0.0;
  (pQVar1->needsRepaint).w = 0.0;
  (pQVar1->needsRepaint).h = 0.0;
  (pQVar1->paintedViewBoundingRects).d = (Data *)0x0;
  (pQVar1->pos).xp = 0.0;
  (pQVar1->pos).yp = 0.0;
  pQVar1->z = 0.0;
  pQVar1->opacity = 1.0;
  pQVar1->scene = (QGraphicsScene *)0x0;
  pQVar1->parent = (QGraphicsItem *)0x0;
  (pQVar1->children).d.d = (Data *)0x0;
  (pQVar1->children).d.ptr = (QGraphicsItem **)0x0;
  (pQVar1->children).d.size = 0;
  pQVar1->transformData = (TransformData *)0x0;
  pQVar1->graphicsEffect = (QGraphicsEffect *)0x0;
  pqVar3 = (qreal *)&DAT_006f1e88;
  pQVar4 = &pQVar1->sceneTransform;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    pQVar4->m_matrix[0][0] = *pqVar3;
    pqVar3 = pqVar3 + (ulong)bVar5 * -2 + 1;
    pQVar4 = (QTransform *)((long)pQVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  *(undefined2 *)&(pQVar1->sceneTransform).field_0x48 = 0;
  pQVar1->index = -1;
  pQVar1->siblingIndex = -1;
  pQVar1->itemDepth = -1;
  pQVar1->focusProxy = (QGraphicsItem *)0x0;
  (pQVar1->focusProxyRefs).d.d = (Data *)0x0;
  (pQVar1->focusProxyRefs).d.ptr = (QGraphicsItem ***)0x0;
  (pQVar1->focusProxyRefs).d.size = 0;
  pQVar1->subFocusItem = (QGraphicsItem *)0x0;
  pQVar1->focusScopeItem = (QGraphicsItem *)0x0;
  pQVar1->imHints = (QFlagsStorageHelper<Qt::InputMethodHint,_4>)0x0;
  pQVar1->panelModality = NonModal;
  (pQVar1->gestureContext).d.d.ptr =
       (QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
        *)0x0;
  *(undefined8 *)&pQVar1->field_0x160 = 0x600000000000bf;
  *(undefined8 *)&pQVar1->field_0x168 = 0xffffffff00000822;
  pQVar1->q_ptr = (QGraphicsItem *)0x0;
  pQVar1->_vptr_QGraphicsItemPrivate =
       (_func_int **)&PTR__QAbstractGraphicsShapeItemPrivate_008128c8;
  QBrush::QBrush((QBrush *)(pQVar1 + 1));
  QPen::QPen((QPen *)&pQVar1[1].extras);
  pQVar1[1].childrenBoundingRect.xp = 0.0;
  pQVar1[1].childrenBoundingRect.yp = 0.0;
  pQVar1[1].extras.d.ptr = (ExtraStruct *)0x0;
  pQVar1[1].extras.d.size = 0;
  (this->super_QGraphicsItem)._vptr_QGraphicsItem = (_func_int **)&PTR__QGraphicsPixmapItem_00811500
  ;
  (this->super_QGraphicsItem).d_ptr.d = pQVar1;
  pQVar1->q_ptr = &this->super_QGraphicsItem;
  QGraphicsItem::setParentItem(&this->super_QGraphicsItem,parent);
  (this->super_QGraphicsItem)._vptr_QGraphicsItem = (_func_int **)&PTR__QGraphicsPixmapItem_008117e0
  ;
  return;
}

Assistant:

QAbstractGraphicsShapeItem::QAbstractGraphicsShapeItem(QGraphicsItem *parent)
    : QGraphicsItem(*new QAbstractGraphicsShapeItemPrivate, parent)
{
}